

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O2

bool __thiscall
google::protobuf::EncodedDescriptorDatabase::Add
          (EncodedDescriptorDatabase *this,void *encoded_file_descriptor,int size)

{
  bool bVar1;
  FileDescriptorProto *file;
  LogMessage *other;
  pair<const_void_*,_int> value;
  undefined1 local_e0 [8];
  Arena arena;
  LogFinisher local_29;
  
  Arena::Arena((Arena *)local_e0);
  file = Arena::CreateMaybeMessage<google::protobuf::FileDescriptorProto>((Arena *)local_e0);
  bVar1 = MessageLite::ParseFromArray((MessageLite *)file,encoded_file_descriptor,size);
  if (bVar1) {
    value.second = size;
    value.first = encoded_file_descriptor;
    value._12_4_ = 0;
    bVar1 = SimpleDescriptorDatabase::DescriptorIndex<std::pair<const_void_*,_int>_>::AddFile
                      (&this->index_,file,value);
  }
  else {
    internal::LogMessage::LogMessage
              ((LogMessage *)&arena.hooks_cookie_,LOGLEVEL_ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/descriptor_database.cc"
               ,0x18b);
    other = internal::LogMessage::operator<<
                      ((LogMessage *)&arena.hooks_cookie_,
                       "Invalid file descriptor data passed to EncodedDescriptorDatabase::Add().");
    internal::LogFinisher::operator=(&local_29,other);
    internal::LogMessage::~LogMessage((LogMessage *)&arena.hooks_cookie_);
    bVar1 = false;
  }
  Arena::~Arena((Arena *)local_e0);
  return bVar1;
}

Assistant:

bool EncodedDescriptorDatabase::Add(const void* encoded_file_descriptor,
                                    int size) {
  google::protobuf::Arena arena;
  auto* file = google::protobuf::Arena::CreateMessage<FileDescriptorProto>(&arena);
  if (file->ParseFromArray(encoded_file_descriptor, size)) {
    return index_.AddFile(*file, std::make_pair(encoded_file_descriptor, size));
  } else {
    GOOGLE_LOG(ERROR) << "Invalid file descriptor data passed to "
                  "EncodedDescriptorDatabase::Add().";
    return false;
  }
}